

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaderparser.cpp
# Opt level: O3

bool __thiscall QHttpHeaderParser::parseStatus(QHttpHeaderParser *this,QByteArrayView status)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  void *pvVar7;
  storage_type *psVar8;
  long lVar9;
  storage_type *__n;
  long lVar10;
  long lVar11;
  char *b;
  long in_FS_OFFSET;
  bool bVar12;
  bool bVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 *local_48;
  long local_38;
  
  psVar8 = status.m_data;
  lVar10 = status.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (10 < lVar10) {
    QVar16.m_data = "HTTP/";
    QVar16.m_size = 5;
    cVar5 = QtPrivate::startsWith(status,QVar16);
    if (((cVar5 != '\0') && (psVar8[6] == '.')) && (psVar8[8] == ' ')) {
      this->majorVersion = psVar8[5] + -0x30;
      this->minorVersion = psVar8[7] + -0x30;
      __n = (storage_type *)(lVar10 - 9);
      pvVar7 = memchr(psVar8 + 9,0x20,(size_t)__n);
      if (pvVar7 == (void *)0x0) {
        bVar12 = false;
        lVar11 = 0;
      }
      else {
        lVar11 = (long)pvVar7 - (long)psVar8;
        bVar12 = 8 < lVar11;
        lVar9 = lVar10;
        if (8 < lVar11) {
          lVar9 = lVar11;
        }
        lVar11 = lVar11 + 1;
        __n = (storage_type *)(lVar9 - 9);
      }
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      uStack_50 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QVar14.m_data = __n;
      QVar14.m_size = (qsizetype)&local_58;
      QtPrivate::toSignedInteger(QVar14,(int)(psVar8 + 9));
      bVar13 = ((ulong)uStack_50 & 1) == 0;
      bVar4 = (ulong)((long)local_58 + 0x80000000) >> 0x20 == 0;
      iVar6 = 0;
      if (bVar4 && bVar13) {
        iVar6 = (int)local_58;
      }
      this->statusCode = iVar6;
      if (bVar12) {
        QVar15.m_data = (storage_type *)(lVar10 - lVar11);
        QVar15.m_size = (qsizetype)&local_58;
        QString::fromLatin1(QVar15);
      }
      else {
        local_58._0_4_ = 0;
        local_58._4_4_ = 0;
        uStack_50._0_4_ = 0;
        uStack_50._4_4_ = 0;
        local_48 = (undefined1 *)0x0;
      }
      pQVar1 = &((this->reasonPhrase).d.d)->super_QArrayData;
      pcVar2 = (this->reasonPhrase).d.ptr;
      *(undefined4 *)&(this->reasonPhrase).d.d = (undefined4)local_58;
      *(undefined4 *)((long)&(this->reasonPhrase).d.d + 4) = local_58._4_4_;
      *(undefined4 *)&(this->reasonPhrase).d.ptr = (undefined4)uStack_50;
      *(undefined4 *)((long)&(this->reasonPhrase).d.ptr + 4) = uStack_50._4_4_;
      qVar3 = (this->reasonPhrase).d.size;
      (this->reasonPhrase).d.size = (qsizetype)local_48;
      local_58 = pQVar1;
      uStack_50 = pcVar2;
      local_48 = (undefined1 *)qVar3;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      if ((bVar4 && bVar13) && (uint)this->majorVersion < 10) {
        bVar12 = (uint)this->minorVersion < 10;
        goto LAB_00194c05;
      }
    }
  }
  bVar12 = false;
LAB_00194c05:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar12;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttpHeaderParser::parseStatus(QByteArrayView status)
{
    // from RFC 2616:
    //        Status-Line = HTTP-Version SP Status-Code SP Reason-Phrase CRLF
    //        HTTP-Version   = "HTTP" "/" 1*DIGIT "." 1*DIGIT
    // that makes: 'HTTP/n.n xxx Message'
    // byte count:  0123456789012

    static const int minLength = 11;
    static const int dotPos = 6;
    static const int spacePos = 8;
    static const char httpMagic[] = "HTTP/";

    if (status.size() < minLength
        || !status.startsWith(httpMagic)
        || status.at(dotPos) != '.'
        || status.at(spacePos) != ' ') {
        // I don't know how to parse this status line
        return false;
    }

    // optimize for the valid case: defer checking until the end
    majorVersion = status.at(dotPos - 1) - '0';
    minorVersion = status.at(dotPos + 1) - '0';

    int i = spacePos;
    qsizetype j = status.indexOf(' ', i + 1);
    const QByteArrayView code = j > i ? status.sliced(i + 1, j - i - 1)
                                      : status.sliced(i + 1);

    bool ok = false;
    statusCode = code.toInt(&ok);

    reasonPhrase = j > i ? QString::fromLatin1(status.sliced(j + 1))
                         : QString();

    return ok && uint(majorVersion) <= 9 && uint(minorVersion) <= 9;
}